

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixmapstyle.cpp
# Opt level: O0

SubControl __thiscall
QPixmapStyle::hitTestComplexControl
          (QPixmapStyle *this,ComplexControl control,QStyleOptionComplex *option,QPoint *pos,
          QWidget *widget)

{
  int in_ESI;
  SubControl sc;
  QWidget *in_stack_00000048;
  QPoint *in_stack_00000050;
  QStyleOptionComplex *in_stack_00000058;
  ComplexControl in_stack_00000064;
  QCommonStyle *in_stack_00000068;
  undefined4 local_4;
  
  local_4 = QCommonStyle::hitTestComplexControl
                      (in_stack_00000068,in_stack_00000064,in_stack_00000058,in_stack_00000050,
                       in_stack_00000048);
  if (in_ESI == 2) {
    if (local_4 == SC_ComboBoxFrame) {
      local_4 = SC_ComboBoxArrow;
    }
    else if (local_4 == SC_ComboBoxEditField) {
      local_4 = SC_ComboBoxListBoxPopup;
    }
  }
  return local_4;
}

Assistant:

QStyle::SubControl QPixmapStyle::hitTestComplexControl(QStyle::ComplexControl control,
                                                       const QStyleOptionComplex *option,
                                                       const QPoint &pos,
                                                       const QWidget *widget) const
{
    const SubControl sc = QCommonStyle::hitTestComplexControl(control, option, pos, widget);
    if (control == CC_ScrollBar) {
        if (sc == SC_ScrollBarAddLine)
            return SC_ScrollBarAddPage;
        else if (sc == SC_ScrollBarSubLine)
            return SC_ScrollBarSubPage;
    }

    return sc;
}